

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O2

parser_error parse_artifact_flags(parser *p)

{
  _Bool _Var1;
  errr eVar2;
  void *pvVar3;
  char *pcVar4;
  char *flag_name;
  parser_error pVar5;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    pVar5 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    _Var1 = parser_hasval(p,"flags");
    pVar5 = PARSE_ERROR_NONE;
    if (_Var1) {
      pcVar4 = parser_getstr(p,"flags");
      pcVar4 = string_make(pcVar4);
      flag_name = strtok(pcVar4," |");
      while (flag_name != (char *)0x0) {
        eVar2 = grab_flag((bitflag *)((long)pvVar3 + 0x48),5,obj_flags,flag_name);
        _Var1 = grab_element_flag((element_info *)((long)pvVar3 + 0x90),flag_name);
        if ((!_Var1) && (eVar2 != 0)) {
          pVar5 = PARSE_ERROR_INVALID_FLAG;
          goto LAB_0018178d;
        }
        flag_name = strtok((char *)0x0," |");
      }
      pVar5 = PARSE_ERROR_NONE;
LAB_0018178d:
      string_free(pcVar4);
    }
  }
  return pVar5;
}

Assistant:

static enum parser_error parse_artifact_flags(struct parser *p) {
	struct artifact *a = parser_priv(p);
	char *s, *t;

	if (!a) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	if (!parser_hasval(p, "flags")) {
		return PARSE_ERROR_NONE;
	}
	s = string_make(parser_getstr(p, "flags"));
	t = strtok(s, " |");
	while (t) {
		bool found = false;
		if (!grab_flag(a->flags, OF_SIZE, obj_flags, t)) {
			found = true;
		}
		if (grab_element_flag(a->el_info, t)) {
			found = true;
		}
		if (!found) {
			break;
		}
		t = strtok(NULL, " |");
	}
	string_free(s);
	return t ? PARSE_ERROR_INVALID_FLAG : PARSE_ERROR_NONE;
}